

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffthdu(fitsfile *fptr,int *nhdu,int *status)

{
  int iVar1;
  int local_34;
  int local_30;
  int tstatus;
  int extnum;
  int ii;
  int *status_local;
  int *nhdu_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    local_30 = fptr->HDUposition + 1;
    *nhdu = fptr->HDUposition;
    if (fptr->Fptr->datastart == -1) {
      fptr_local._4_4_ = *status;
    }
    else {
      local_34 = 0;
      tstatus = local_30;
      _extnum = status;
      status_local = nhdu;
      nhdu_local = &fptr->HDUposition;
      while( true ) {
        iVar1 = ffmahd((fitsfile *)nhdu_local,tstatus,(int *)0x0,&local_34);
        if (0 < iVar1) break;
        *status_local = tstatus;
        tstatus = tstatus + 1;
      }
      ffmahd((fitsfile *)nhdu_local,local_30,(int *)0x0,_extnum);
      fptr_local._4_4_ = *_extnum;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffthdu(fitsfile *fptr,      /* I - FITS file pointer                    */
           int *nhdu,            /* O - number of HDUs in the file           */
           int *status)         /* IO - error status                        */
/*
  Return the number of HDUs that currently exist in the file.
*/
{
    int ii, extnum, tstatus;

    if (*status > 0)
        return(*status);

    extnum = fptr->HDUposition + 1;  /* save the current HDU number */
    *nhdu = extnum - 1;

    /* if the CHDU is empty or not completely defined, just return */
    if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        return(*status);

    tstatus = 0;

    /* loop until EOF */
    for (ii=extnum; ffmahd(fptr, ii, 0, &tstatus) <= 0; ii++)
    {
        *nhdu = ii;
    }

    ffmahd(fptr, extnum, 0, status);       /* restore orig file position */
    return(*status);
}